

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<double,_20>::~TPZManVector(TPZManVector<double,_20> *this)

{
  TPZManVector<double,_20> *in_RDI;
  
  ~TPZManVector(in_RDI);
  operator_delete(in_RDI,0xc0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}